

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

bool __thiscall cppforth::Forth::interpretNumbers(Forth *this,string *value)

{
  byte bVar1;
  bool bVar2;
  Cell CVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pcVar6;
  unsigned_long uVar7;
  byte *pbVar8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var9;
  bool bVar10;
  double x;
  FCell number_1;
  double significantStd;
  __unspec local_11a;
  type local_119;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  __unspec local_10a;
  type local_109;
  char *local_108;
  char *local_100;
  __unspec local_f4;
  type local_f3;
  __unspec local_f2;
  type local_f1;
  char *local_f0;
  char *local_e8;
  const_iterator local_e0;
  const_iterator returnValue_2;
  const_iterator cStack_d0;
  char firstChar_2;
  const_iterator end_2;
  const_iterator begin_2;
  bool exponentSignNegative;
  undefined4 uStack_b8;
  bool signNegative_1;
  uint number;
  SDCell numberD;
  const_iterator local_a0;
  const_iterator returnValue_1;
  char firstChar_1;
  const_iterator cStack_90;
  int localBase_1;
  anon_union_8_2_340ac67b_for_data_ local_88;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_1;
  const_iterator begin_1;
  int numberInt;
  const_iterator local_60;
  const_iterator returnValue;
  char firstChar;
  const_iterator cStack_50;
  int localBase;
  const_iterator end;
  const_iterator begin;
  longlong numericIntValue;
  bool signNegative;
  size_type valueSize;
  int base;
  string *value_local;
  Forth *this_local;
  
  CVar3 = getNumericBase(this);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (value);
  if ((sVar4 != 0) &&
     (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](value,sVar4 - 1), *pvVar5 != '.')) {
    end = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                    (value);
    cStack_50 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                          (value);
    returnValue._M_current._4_4_ = CVar3;
    pcVar6 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&end);
    returnValue._M_current._3_1_ = *pcVar6;
    if (returnValue._M_current._3_1_ == '#') {
      returnValue._M_current._4_4_ = 10;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end);
    }
    else if (returnValue._M_current._3_1_ == '$') {
      returnValue._M_current._4_4_ = 0x10;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end);
    }
    else if (returnValue._M_current._3_1_ == '%') {
      returnValue._M_current._4_4_ = 2;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end);
    }
    pcVar6 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&end);
    returnValue._M_current._3_1_ = *pcVar6;
    bVar10 = returnValue._M_current._3_1_ == '-';
    if (bVar10) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end);
    }
    local_60._M_current = end._M_current;
    uVar7 = parseUnsignedNumber(end,cStack_50,&local_60,returnValue._M_current._4_4_);
    begin._M_current._0_4_ = (Cell)uVar7;
    bVar2 = __gnu_cxx::
            operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&local_60,&stack0xffffffffffffffb0);
    if (bVar2) {
      if (bVar10) {
        begin._M_current._0_4_ = -(Cell)begin._M_current;
      }
      CVar3 = getIsCompiling(this);
      if (CVar3 == 0) {
        push(this,(Cell)begin._M_current);
      }
      else {
        data(this,1);
        data(this,(Cell)begin._M_current);
      }
      return true;
    }
  }
  if ((1 < sVar4) &&
     (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](value,sVar4 - 1), *pvVar5 == '.')) {
    end_1._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin(value);
    cStack_90 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                          (value);
    local_88.Cells =
         (anon_struct_8_2_f9ee98fb_for_Cells)
         __gnu_cxx::
         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator-(&stack0xffffffffffffff70,1);
    returnValue_1._M_current._4_4_ = CVar3;
    pcVar6 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&end_1);
    returnValue_1._M_current._3_1_ = *pcVar6;
    if (returnValue_1._M_current._3_1_ == '#') {
      returnValue_1._M_current._4_4_ = 10;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end_1);
    }
    else if (returnValue_1._M_current._3_1_ == '$') {
      returnValue_1._M_current._4_4_ = 0x10;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end_1);
    }
    else if (returnValue_1._M_current._3_1_ == '%') {
      returnValue_1._M_current._4_4_ = 2;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end_1);
    }
    pcVar6 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&end_1);
    returnValue_1._M_current._3_1_ = *pcVar6;
    bVar10 = returnValue_1._M_current._3_1_ == '-';
    if (bVar10) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end_1);
    }
    local_a0._M_current = end_1._M_current;
    numberD.data_ =
         (anon_union_8_2_340ac67b_for_data_)(anon_union_8_2_340ac67b_for_data_)local_88.Cells;
    begin._M_current =
         (char *)parseUnsignedNumber(end_1._M_current,(const_iterator)local_88.Cells,&local_a0,
                                     returnValue_1._M_current._4_4_);
    bVar2 = __gnu_cxx::
            operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&local_a0,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_88.Cells);
    if (bVar2) {
      if (bVar10) {
        begin._M_current = (char *)-(long)begin._M_current;
      }
      SDCell::SDCell((SDCell *)&stack0xffffffffffffff48,(longlong)begin._M_current);
      CVar3 = getIsCompiling(this);
      if (CVar3 == 0) {
        push(this,uStack_b8);
        push(this,number);
      }
      else {
        data(this,1);
        data(this,uStack_b8);
        data(this,1);
        data(this,number);
      }
      return true;
    }
  }
  if (((sVar4 == 3) &&
      (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator[](value,0), *pvVar5 == '\'')) &&
     (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](value,2), *pvVar5 == '\'')) {
    pbVar8 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[](value,1);
    bVar1 = *pbVar8;
    CVar3 = getIsCompiling(this);
    if (CVar3 == 0) {
      push(this,(uint)bVar1);
    }
    else {
      data(this,1);
      data(this,(uint)bVar1);
    }
    this_local._7_1_ = true;
  }
  else {
    end_2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                      (value);
    cStack_d0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                          (value);
    pcVar6 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&end_2);
    returnValue_2._M_current._7_1_ = *pcVar6;
    if (returnValue_2._M_current._7_1_ == '-') {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end_2);
    }
    else if (returnValue_2._M_current._7_1_ == '+') {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end_2);
    }
    local_e0._M_current = end_2._M_current;
    local_e8 = end_2._M_current;
    local_f0 = cStack_d0._M_current;
    skipDecimalDigits(end_2,cStack_d0,&local_e0);
    local_f1 = (type)__gnu_cxx::operator<=><char_const*,std::__cxx11::string>(&local_e0,&end_2);
    std::__cmp_cat::__unspec::__unspec(&local_f2,(__unspec *)0x0);
    bVar10 = std::operator>(local_f1);
    if (bVar10) {
      local_f3 = (type)__gnu_cxx::operator<=><char_const*,std::__cxx11::string>
                                 (&local_e0,&stack0xffffffffffffff30);
      std::__cmp_cat::__unspec::__unspec(&local_f4,(__unspec *)0x0);
      bVar10 = std::operator<(local_f3);
      if (bVar10) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_e0);
        returnValue_2._M_current._7_1_ = *pcVar6;
        if (returnValue_2._M_current._7_1_ == '.') {
          p_Var9 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(&local_e0);
          local_100 = p_Var9->_M_current;
          local_108 = cStack_d0._M_current;
          end_2._M_current = local_100;
          skipDecimalDigits((const_iterator)local_100,cStack_d0,&local_e0);
        }
        local_109 = (type)__gnu_cxx::operator<=><char_const*,std::__cxx11::string>
                                    (&local_e0,&stack0xffffffffffffff30);
        std::__cmp_cat::__unspec::__unspec(&local_10a,(__unspec *)0x0);
        bVar10 = std::operator<(local_109);
        if (bVar10) {
          local_118 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator++(&local_e0,0);
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_118);
          returnValue_2._M_current._7_1_ = *pcVar6;
          if ((returnValue_2._M_current._7_1_ == 'E') || (returnValue_2._M_current._7_1_ == 'e')) {
            local_119 = (type)__gnu_cxx::operator<=><char_const*,std::__cxx11::string>
                                        (&local_e0,&stack0xffffffffffffff30);
            std::__cmp_cat::__unspec::__unspec(&local_11a,(__unspec *)0x0);
            bVar10 = std::operator<(local_119);
            if (bVar10) {
              pcVar6 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_e0);
              returnValue_2._M_current._7_1_ = *pcVar6;
              if (returnValue_2._M_current._7_1_ == '-') {
                __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&local_e0);
              }
              else if (returnValue_2._M_current._7_1_ == '+') {
                __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&local_e0);
              }
              end_2._M_current = local_e0._M_current;
              skipDecimalDigits(local_e0,cStack_d0,&local_e0);
              bVar10 = __gnu_cxx::
                       operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 (&local_e0,&stack0xffffffffffffff30);
              if (((bVar10 ^ 0xffU) & 1) != 0) {
                return false;
              }
            }
            x = std::__cxx11::stod(value,(size_t *)0x0);
            CVar3 = getIsCompiling(this);
            if (CVar3 == 0) {
              ForthStack<double>::push(&this->fStack,x);
            }
            else {
              data(this,0x12);
              dataFloat(this,x);
            }
            return true;
          }
        }
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool interpretNumbers(const std::string &value){
			int base = getNumericBase();
			auto valueSize=value.length();
			bool signNegative{};
			long long numericIntValue{};
			// consider it is signed int
			if(valueSize>0 && value[valueSize-1]!='.'){
				auto begin=value.begin();
				auto end=value.end();
				auto localBase=base;
				auto firstChar=*begin;
				if(firstChar=='#') {localBase=10; ++begin;}
				else if(firstChar=='$') {localBase=16; ++begin;}
				else if(firstChar=='%') {localBase=2; ++begin;}
				firstChar=*begin;
				if(firstChar=='-') {signNegative=true; ++begin;}
				else {signNegative=false;};
				auto returnValue{begin};
				numericIntValue=parseUnsignedNumber(begin,end,returnValue,localBase);
				if(returnValue==end){
					if(signNegative) numericIntValue=-numericIntValue;
					int numberInt{static_cast<int>(numericIntValue)};
					if (getIsCompiling()) {
						data(CELL(doLiteralXt));
						data(numberInt);
					}
					else {
						push(numberInt);
					}
					return true;
				}
			}

			// consider it is double int
			if(valueSize>1 && value[valueSize-1]=='.'){
				auto begin=value.begin();
				auto end=value.end()-1;
				auto localBase=base;
				auto firstChar=*begin;
				if(firstChar=='#') {localBase=10; ++begin;}
				else if(firstChar=='$') {localBase=16; ++begin;}
				else if(firstChar=='%') {localBase=2; ++begin;}
				firstChar=*begin;
				if(firstChar=='-') {signNegative=true; ++begin;}
				else {signNegative=false;};
				auto returnValue{begin};
				numericIntValue=parseUnsignedNumber(begin,end,returnValue,localBase);
				if(returnValue==end){
					if(signNegative) numericIntValue=-numericIntValue;
					SDCell numberD(numericIntValue);
					if (getIsCompiling()) {
						data(CELL(doLiteralXt));
						data(numberD.data_.Cells.lo);
						data(CELL(doLiteralXt));
						data(numberD.data_.Cells.hi);
					}
					else {
						push(numberD.data_.Cells.lo);
						push(numberD.data_.Cells.hi);
					}
					return true;
				}

			}
			// consider it is char
			if (valueSize==3 && value[0]=='\'' and value[2]=='\''){
				unsigned number;
				number = static_cast<unsigned char>(value[1]);
				if (getIsCompiling()) {
					data(CELL(doLiteralXt));
					data(number);
				}
				else {
					push(number);
				}
				return true;
			}			
#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT
/*
if(0){
			std::smatch m1{};
			bool found{};
			static std::regex regexFloat{ "^[-+]?(([0-9]*[\\.]{0,1}[0-9]+)|([0-9]+[\\.]{0,1}[0-9]*))([eE][-+]?[0-9]*)?$" };
			found = regex_search(value, m1, regexFloat);
			if (found){
				FCell number = std::stod(value);
				if (getIsCompiling()) {
					data(CELL(doFLiteralXt));
					dataFloat(number);
				}
				else {
					fStack.push(number);
				}
				return true;
			}
} else
*/
 			{
				// used for own calculation of value without library function
				//long long significandDigits{},exponentDigits0{};
				//double significandDigits0{};
				bool signNegative{},exponentSignNegative{};
				auto begin=value.begin();
				auto end=value.end();
				auto firstChar=*begin;
				if(firstChar=='-') { signNegative=true; ++begin;}
				else if(firstChar=='+') {signNegative=false; ++begin;}
				auto returnValue{begin};
				// own calculation: significandDigits=parseUnsignedNumber(begin,end,returnValue,10);
				skipDecimalDigits(begin,end,returnValue);
				if(returnValue>begin && returnValue<end){ // value has at least 1 decimal digit
					firstChar=*returnValue;
					if(firstChar=='.'){
						begin=++returnValue;
						// own calculation: significandDigits0=parseUnsignedNumberAsFloat(begin,end,returnValue,10);
						skipDecimalDigits(begin,end,returnValue);
					}
					if(returnValue<end){
						firstChar=*returnValue++;
						if(firstChar=='E' || firstChar=='e'){
							if(returnValue<end){
								firstChar=*returnValue;
								if(firstChar=='-') { exponentSignNegative=true; ++returnValue;}
								else if(firstChar=='+') {exponentSignNegative=false; ++returnValue;}
								begin=returnValue;
								// own calculation: exponentDigits0=parseUnsignedNumber(begin,end,returnValue,10);
								skipDecimalDigits(begin,end,returnValue);
								if(returnValue!=end){
									return false;
								}
								// own calculation: if(exponentSignNegative) exponentDigits0=-exponentDigits0;
							}
							// pattern matched
							// convert numbers to digits;
							
							// own calculation: double significant1=significandDigits;
							// own calculation: significant1+=significandDigits0;
							// own calculation: significant1*=std::pow(10,exponentDigits0);
							// own calculation: if(signNegative) significant1=-significant1;
							
							// standard library function provides better precision
							double significantStd=std::stod(value);
							//if(significant1!=significantStd){static int cnt=0;
							//std::cerr <<++cnt<<" Value "<<value<<" My "<<std::setprecision(20)<<significant1<< " , STD "<<std::setprecision(20)<<significantStd 
							//<<" Diff " <<(significant1-significantStd) 
							//<<std::endl;
							//}
							FCell number = significantStd;
							if (getIsCompiling()) {
								data(CELL(doFLiteralXt));
								dataFloat(number);
							}
							else {
								fStack.push(number);
							}
							return true;


						}
					}
				}
			}

#endif
			return false;
}